

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O1

Movement StrToMovement(string *move)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 uVar7;
  Movement MVar8;
  string s;
  undefined1 *local_90;
  char *local_88;
  undefined1 local_80 [16];
  char *local_70 [2];
  char local_60 [16];
  byte *local_50 [2];
  byte local_40 [16];
  
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  std::__cxx11::string::push_back((char)(string *)&local_90);
  std::__cxx11::string::push_back((char)&local_90);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,local_90,local_88 + (long)local_90);
  bVar1 = *local_50[0];
  bVar2 = local_50[0][1];
  uVar5 = (&UINT_0010ef60)[(int)(char)bVar2];
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::__cxx11::string::_M_replace((ulong)&local_90,0,local_88,0x10f2d3);
  std::__cxx11::string::push_back((char)&local_90);
  std::__cxx11::string::push_back((char)&local_90);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,local_90,local_88 + (long)local_90);
  cVar3 = *local_70[0];
  cVar4 = local_70[0][1];
  uVar6 = (&UINT_0010ef60)[(int)cVar4];
  uVar7 = extraout_EDX;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
    uVar7 = extraout_EDX_00;
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
    uVar7 = extraout_EDX_01;
  }
  MVar8._0_4_ = (bVar1 + 0xa2 | (uVar5 + (int)(char)bVar2) * 0x10) & 0xff |
                (cVar3 * 0x100 + 0xa200U | (uVar6 + (int)cVar4) * 0x1000) & 0xffff;
  MVar8.value = 0;
  MVar8.catc = (char)uVar7;
  MVar8.movec = (char)((uint)uVar7 >> 8);
  MVar8._10_2_ = (short)((uint)uVar7 >> 0x10);
  return MVar8;
}

Assistant:

Movement  StrToMovement(const std::string move) {
	std::string s = "";
	s += move[0]; 
    s += move[1];
	int from = StrToInt (s);
	s = ""; 
    s += move[2]; 
    s += move[3];
	int to = StrToInt (s);
    Movement movement;
    movement.from = from;
    movement.to = to;
    movement.capture = 0;
	return movement;
}